

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::GenerateNotesFile
          (cmCTest *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  cmXMLWriter xml;
  cmGeneratedFileStream ofs;
  long *local_428;
  long local_418 [2];
  undefined1 local_408 [112];
  ios_base local_398 [264];
  cmGeneratedFileStream local_290;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&local_290,None);
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_408._0_8_ = local_408 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Notes.xml","");
  bVar2 = OpenOutputFile(this,&(_Var1._M_head_impl)->CurrentTag,(string *)local_408,&local_290,false
                        );
  if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
    operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
  }
  if (bVar2) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_408,(ostream *)&local_290,0);
    GenerateCTestNotesOutput(this,(cmXMLWriter *)local_408,files);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_408);
    iVar3 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_408,"Cannot open notes file",0x16);
    std::ios::widen((char)(ostream *)local_408 + (char)*(undefined8 *)(local_408._0_8_ + -0x18));
    std::ostream::put((char)local_408);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x625,(char *)local_428,false);
    if (local_428 != local_418) {
      operator_delete(local_428,local_418[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    std::ios_base::~ios_base(local_398);
    iVar3 = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_290);
  return iVar3;
}

Assistant:

int cmCTest::GenerateNotesFile(std::vector<std::string> const& files)
{
  cmGeneratedFileStream ofs;
  if (!this->OpenOutputFile(this->Impl->CurrentTag, "Notes.xml", ofs)) {
    cmCTestLog(this, ERROR_MESSAGE, "Cannot open notes file" << std::endl);
    return 1;
  }
  cmXMLWriter xml(ofs);
  this->GenerateCTestNotesOutput(xml, files);
  return 0;
}